

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall Timer::Timer(Timer *this)

{
  impl_t *this_00;
  double dVar1;
  double dVar2;
  int local_44;
  double dStack_40;
  int i;
  double sum;
  double last;
  double cur;
  double first;
  Timer *this_local;
  
  this_00 = (impl_t *)operator_new(1);
  impl_t::impl_t(this_00);
  std::unique_ptr<Timer::impl_t,std::default_delete<Timer::impl_t>>::
  unique_ptr<std::default_delete<Timer::impl_t>,void>
            ((unique_ptr<Timer::impl_t,std::default_delete<Timer::impl_t>> *)this,this_00);
  std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::set(&this->timers);
  std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::set(&this->execlist);
  dVar1 = GetTime();
  dStack_40 = 0.0;
  local_44 = 0;
  sum = dVar1;
  while (local_44 < 100) {
    dVar2 = GetTime();
    if ((dVar2 != sum) || (NAN(dVar2) || NAN(sum))) {
      dStack_40 = (dVar2 - sum) + dStack_40;
      local_44 = local_44 + 1;
      sum = dVar2;
    }
  }
  this->resolution = dStack_40 / 100.0 - dVar1;
  this->changed = true;
  return;
}

Assistant:

Timer::Timer()
	: impl(new impl_t)
{
#ifdef WIN32
#ifndef TIMER_GETTICKCOUNT
	for (int res = 1; res <= 50; ++res)
	{
		if (timeBeginPeriod(res) == TIMERR_NOERROR)
		{
			rres = res;
			break;
		}
	}
#endif // TIMER_GETTICKCOUNT
#endif // WIN32
	double first = Timer::GetTime();
	double cur;
	double last = first;
	double sum = 0.0;

	for (int i = 0; i < 100; )
	{
		cur = Timer::GetTime();

		if (cur != last)
		{
			sum += cur - last;
			last = cur;
			++i;
		}
	};

	this->resolution = sum / 100.0 - first;

	this->changed = true;
}